

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<32768u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<32768u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  value_type_conflict4 *pvVar1;
  value_type_conflict4 *pvVar2;
  int *piVar3;
  int *piVar4;
  byte bVar5;
  unsigned_fast_type i;
  long lVar6;
  byte bVar7;
  sbyte sVar8;
  void *in_RCX;
  uint uVar10;
  ulong uVar9;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> result_max;
  uintwide_t<24U,_unsigned_char,_void,_false> local_4020 [1365];
  uintwide_t<24U,_unsigned_char,_void,_false> local_3020 [1365];
  uint local_2020 [1024];
  int local_1020 [1024];
  
  uVar11 = 0;
  memset(this,0,0x1000);
  uVar10._0_3_ = input_params->param_a;
  uVar10._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  bVar5 = 1;
  lVar6 = 0;
  do {
    bVar7 = bVar5 - 1 & 3;
    if (bVar7 == 0) {
      uVar12 = (uVar10 % 0xadc8) * 0xbc8f;
      uVar11 = (uVar10 / 0xadc8) * 0xd47;
      uVar10 = (uVar10 / 0xadc8) * -0xd47;
      if (uVar12 < uVar11) {
        uVar10 = uVar11 ^ 0x7fffffff;
      }
      uVar10 = uVar10 + uVar12;
      *(uint *)input_params = uVar10;
      uVar11 = uVar10;
    }
    sVar8 = bVar7 << 3;
    *(uint *)(this + lVar6) = *(uint *)(this + lVar6) | (uVar11 >> sVar8 & 0xff) << sVar8;
    lVar6 = lVar6 + (ulong)((bVar5 & 3) == 0) * 4;
    bVar5 = bVar5 + 1;
  } while (lVar6 != 0x1000);
  memcpy(local_4020,in_RCX,0x1000);
  memset(local_3020,0,0x1000);
  lVar6 = 0xffc;
  do {
    if (lVar6 == -4) {
      memcpy(local_2020,(void *)((long)in_RCX + 0x1000),0x1000);
      memset(local_1020,0xff,0x1000);
      lVar6 = 0xffc;
      goto LAB_00159fb4;
    }
    pvVar1 = local_4020[0].values.super_array<unsigned_char,_3UL>.elems + lVar6;
    pvVar2 = local_3020[0].values.super_array<unsigned_char,_3UL>.elems + lVar6;
    lVar6 = lVar6 + -4;
  } while (*(int *)pvVar1 == *(int *)pvVar2);
  goto LAB_00159fd5;
  while (piVar3 = (int *)((long)local_2020 + lVar6), piVar4 = (int *)((long)local_1020 + lVar6),
        lVar6 = lVar6 + -4, *piVar3 == *piVar4) {
LAB_00159fb4:
    if (lVar6 == -4) goto LAB_0015a0d2;
  }
LAB_00159fd5:
  memcpy(local_4020,(void *)((long)in_RCX + 0x1000),0x1000);
  memcpy(local_2020,in_RCX,0x1000);
  lVar6 = 0;
  bVar13 = false;
  do {
    uVar9 = ((ulong)*(uint *)((long)local_4020 + lVar6 * 4) - (ulong)bVar13) -
            (ulong)local_2020[lVar6];
    *(int *)((long)local_4020 + lVar6 * 4) = (int)uVar9;
    bVar13 = uVar9 >> 0x20 != 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x400);
  memcpy((uniform_int_distribution<32768u,unsigned_int,void,false> *)local_3020,local_4020,0x1000);
  lVar6 = 0;
  do {
    pvVar1 = local_3020[0].values.super_array<unsigned_char,_3UL>.elems + lVar6;
    *(int *)pvVar1 = *(int *)pvVar1 + 1;
    if (*(int *)pvVar1 != 0) break;
    bVar13 = lVar6 != 0xffc;
    lVar6 = lVar6 + 4;
  } while (bVar13);
  if ((uniform_int_distribution<32768u,unsigned_int,void,false> *)local_3020 == this) {
    memset(this,0,0x1000);
  }
  else {
    memset(local_4020,0,0x1000);
    uintwide_t<32768U,_unsigned_int,_void,_false>::eval_divide_knuth
              ((uintwide_t<32768U,_unsigned_int,_void,_false> *)this,local_3020,local_4020);
    memcpy(this,local_4020,0x1000);
  }
  memcpy(local_4020,in_RCX,0x1000);
  uintwide_t<32768U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<32768U,_unsigned_int,_void,_false> *)this,local_4020);
LAB_0015a0d2:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }